

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

bool __thiscall FlowGraph::IsUnsignedOpnd(FlowGraph *this,Opnd *src,Opnd **pShrSrc1)

{
  bool bVar1;
  int32 iVar2;
  RegOpnd *pRVar3;
  Instr *this_00;
  Opnd *pOVar4;
  Opnd *shrSrc;
  Opnd *shrCnt;
  Instr *shrUInstr;
  int32 intConst;
  Opnd **pShrSrc1_local;
  Opnd *src_local;
  FlowGraph *this_local;
  
  bVar1 = IR::Opnd::IsRegOpnd(src);
  if (bVar1) {
    pRVar3 = IR::Opnd::AsRegOpnd(src);
    bVar1 = StackSym::IsSingleDef(pRVar3->m_sym);
    if (bVar1) {
      pRVar3 = IR::Opnd::AsRegOpnd(src);
      bVar1 = StackSym::IsIntConst(pRVar3->m_sym);
      if (bVar1) {
        pRVar3 = IR::Opnd::AsRegOpnd(src);
        iVar2 = StackSym::GetIntConstValue(pRVar3->m_sym);
        if (iVar2 < 0) {
          this_local._7_1_ = false;
        }
        else {
          *pShrSrc1 = src;
          this_local._7_1_ = true;
        }
      }
      else {
        pRVar3 = IR::Opnd::AsRegOpnd(src);
        this_00 = StackSym::GetInstrDef(pRVar3->m_sym);
        if (this_00->m_opcode == ShrU_A) {
          pOVar4 = IR::Instr::GetSrc2(this_00);
          bVar1 = IR::Opnd::IsRegOpnd(pOVar4);
          if (bVar1) {
            pRVar3 = IR::Opnd::AsRegOpnd(pOVar4);
            bVar1 = StackSym::IsTaggableIntConst(pRVar3->m_sym);
            if (bVar1) {
              pRVar3 = IR::Opnd::AsRegOpnd(pOVar4);
              iVar2 = StackSym::GetIntConstValue(pRVar3->m_sym);
              if (iVar2 == 0) {
                pOVar4 = IR::Instr::GetSrc1(this_00);
                *pShrSrc1 = pOVar4;
                return true;
              }
            }
          }
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FlowGraph::IsUnsignedOpnd(IR::Opnd *src, IR::Opnd **pShrSrc1)
{
    // Look for an unsigned constant, or the result of an unsigned shift by zero
    if (!src->IsRegOpnd())
    {
        return false;
    }
    if (!src->AsRegOpnd()->m_sym->IsSingleDef())
    {
        return false;
    }

    if (src->AsRegOpnd()->m_sym->IsIntConst())
    {
        int32 intConst = src->AsRegOpnd()->m_sym->GetIntConstValue();

        if (intConst >= 0)
        {
            *pShrSrc1 = src;
            return true;
        }
        else
        {
            return false;
        }
    }

    IR::Instr * shrUInstr = src->AsRegOpnd()->m_sym->GetInstrDef();

    if (shrUInstr->m_opcode != Js::OpCode::ShrU_A)
    {
        return false;
    }

    IR::Opnd *shrCnt = shrUInstr->GetSrc2();

    if (!shrCnt->IsRegOpnd() || !shrCnt->AsRegOpnd()->m_sym->IsTaggableIntConst() || shrCnt->AsRegOpnd()->m_sym->GetIntConstValue() != 0)
    {
        return false;
    }

    IR::Opnd *shrSrc = shrUInstr->GetSrc1();

    *pShrSrc1 = shrSrc;
    return true;
}